

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::Process
          (ReplaceDescArrayAccessUsingVarIndex *this)

{
  bool bVar1;
  Instruction *var_00;
  IRContext *context;
  Instruction *var;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  Status status;
  ReplaceDescArrayAccessUsingVarIndex *this_local;
  
  __range2._4_4_ = SuccessWithoutChange;
  Pass::context(&this->super_Pass);
  IRContext::types_values((IRContext *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&var);
  while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&var), bVar1) {
    var_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    context = Pass::context(&this->super_Pass);
    bVar1 = descsroautil::IsDescriptorArray(context,var_00);
    if ((bVar1) && (bVar1 = ReplaceVariableAccessesWithConstantElements(this,var_00), bVar1)) {
      __range2._4_4_ = SuccessWithChange;
    }
    InstructionList::iterator::operator++(&__end2);
  }
  return __range2._4_4_;
}

Assistant:

Pass::Status ReplaceDescArrayAccessUsingVarIndex::Process() {
  Status status = Status::SuccessWithoutChange;
  for (Instruction& var : context()->types_values()) {
    if (descsroautil::IsDescriptorArray(context(), &var)) {
      if (ReplaceVariableAccessesWithConstantElements(&var))
        status = Status::SuccessWithChange;
    }
  }
  return status;
}